

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QString>::copyAppend
          (QGenericArrayOps<QString> *this,QString *b,QString *e)

{
  QString *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QString>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QString>).size;
    do {
      pDVar2 = (b->d).d;
      pQVar1[lVar3].d.d = pDVar2;
      pQVar1[lVar3].d.ptr = (b->d).ptr;
      pQVar1[lVar3].d.size = (b->d).size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QString>).size;
      }
      b = b + 1;
      lVar3 = lVar3 + 1;
      (this->super_QArrayDataPointer<QString>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }